

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_svr4_gzip.c
# Opt level: O1

void test_read_format_cpio_svr4_gzip(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  archive_entry *ae;
  archive_entry *local_38;
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                   ,L')',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)0x0);
  iVar1 = archive_read_support_filter_gzip(a);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                   ,L'-');
    test_skipping("gzip reading not fully supported on this platform");
    wVar2 = L'.';
  }
  else {
    iVar1 = archive_read_support_format_all(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        (void *)0x0);
    iVar1 = archive_read_open_memory(a,archive,100);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_open_memory(a, archive, sizeof(archive))",(void *)0x0);
    iVar1 = archive_read_next_header(a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        (void *)0x0);
    iVar1 = archive_filter_code(a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L'6',(long)iVar1,"archive_filter_code(a, 0)",1,"ARCHIVE_FILTER_GZIP",
                        (void *)0x0);
    iVar1 = archive_format(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L'8',(long)iVar1,"archive_format(a)",0x10004,
                        "ARCHIVE_FORMAT_CPIO_SVR4_NOCRC",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L'9',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L':',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
    iVar1 = archive_read_close(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    wVar2 = L'<';
  }
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_svr4_gzip)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualInt(ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_GZIP);
	assertEqualInt(archive_format(a),
	    ARCHIVE_FORMAT_CPIO_SVR4_NOCRC);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}